

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

SimpleString BracketsFormattedHexString(SimpleString *hexString)

{
  size_t extraout_RDX;
  SimpleString SVar1;
  SimpleString local_58 [2];
  SimpleString local_38;
  SimpleString local_28;
  SimpleString *hexString_local;
  
  hexString_local = hexString;
  SimpleString::SimpleString(&local_38,"(0x");
  SimpleString::operator+(&local_28,&local_38);
  SimpleString::SimpleString(local_58,")");
  SimpleString::operator+(hexString,&local_28);
  SimpleString::~SimpleString(local_58);
  SimpleString::~SimpleString(&local_28);
  SimpleString::~SimpleString(&local_38);
  SVar1.bufferSize_ = extraout_RDX;
  SVar1.buffer_ = (char *)hexString;
  return SVar1;
}

Assistant:

SimpleString BracketsFormattedHexString(SimpleString hexString)
{
    return SimpleString("(0x") + hexString + ")" ;
}